

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_eff_lash_type(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  char *name;
  wchar_t wVar3;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    name = parser_getstr(p,"type");
    wVar1 = proj_name_to_idx(name);
    wVar3 = L'\x15';
    if (L'\xffffffff' < wVar1) {
      wVar3 = wVar1;
    }
    *(wchar_t *)((long)pvVar2 + 0x2c) = wVar3;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("eff",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-init.c"
                ,0x196,"enum parser_error parse_eff_lash_type(struct parser *)");
}

Assistant:

static enum parser_error parse_eff_lash_type(struct parser *p) {
	struct blow_effect *eff = parser_priv(p);
	int type;
	assert(eff);

	type = proj_name_to_idx(parser_getstr(p, "type"));
	eff->lash_type = type >= 0 ? type : PROJ_MISSILE;
	return PARSE_ERROR_NONE;
}